

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

int ndiGetBXMarkerInfo(ndicapi *pol,int portHandle,int marker,char *outMarkerInfo)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar2 = 0;
  if (marker < 0x14) {
    bVar1 = pol->BxHandleCount;
    if (bVar1 == 0) {
      uVar5 = 0;
    }
    else {
      uVar4 = 0;
      do {
        uVar5 = uVar4;
        if (pol->BxHandles[uVar4] == portHandle) break;
        uVar4 = uVar4 + 1;
        uVar5 = (ulong)bVar1;
      } while (bVar1 != uVar4);
    }
    iVar2 = 1;
    if ((uint)uVar5 != (uint)bVar1) {
      bVar1 = pol->BxToolMarkerInformation[uVar5 & 0xffffffff][0xb - marker / 2];
      bVar3 = bVar1 & 0xf0;
      if ((marker & 1U) == 0) {
        bVar3 = bVar1;
      }
      *outMarkerInfo = bVar3;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

ndicapiExport int ndiGetBXMarkerInfo(ndicapi* pol, int portHandle, int marker, char& outMarkerInfo)
{
  int i, n;

  if (marker >= 20)
  {
    return false;
  }

  n = pol->BxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->BxHandles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return NDI_DISABLED;
  }

  int byteIndex = marker / 2;
  if (marker % 2 == 0)
  {
    // low 4 bits, little endian format, so index backwards from the rear
    outMarkerInfo = pol->BxToolMarkerInformation[i][1 + (10 - byteIndex)] & 0x00FF;
  }
  else
  {
    // high 4 bits, little endian format, so index backwards from the rear
    outMarkerInfo = pol->BxToolMarkerInformation[i][1 + (10 - byteIndex)] & 0xFF00 >> 4;
  }
  return NDI_OKAY;
}